

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_RC TPM2_EncryptDecrypt(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT keyHandle,
                          TPMI_YES_NO decrypt,TPM_ALG_ID cipherMode,TPM2B_IV *ivIn,
                          TPM2B_MAX_BUFFER *inData,TPM2B_MAX_BUFFER *outData,TPM2B_IV *ivOut)

{
  UINT16 UVar1;
  ushort uVar2;
  TPM_RC TVar3;
  TPM_RC TVar4;
  TSS_CMD_CONTEXT CmdCtx;
  INT32 local_3088;
  TPMI_YES_NO local_3081;
  BYTE *local_3080;
  TPMI_DH_OBJECT local_3078;
  TPM_ALG_ID local_3072;
  TSS_SESSION *local_3070;
  TPM2B_IV local_3062;
  TSS_CMD_CONTEXT local_3050;
  
  local_3088 = 0x1000;
  local_3080 = local_3050.ParamBuffer;
  local_3050.ParamSize = 0;
  local_3081 = decrypt;
  local_3078 = keyHandle;
  local_3072 = cipherMode;
  local_3070 = session;
  UVar1 = UINT8_Marshal(&local_3081,&local_3080,&local_3088);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  UVar1 = UINT16_Marshal(&local_3072,&local_3080,&local_3088);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  if (ivIn == (TPM2B_IV *)0x0) {
    uVar2 = UINT16_Marshal(&NullSize,&local_3080,&local_3088);
  }
  else {
    uVar2 = TPM2B_IV_Marshal(ivIn,&local_3080,&local_3088);
  }
  local_3050.ParamSize = uVar2 + local_3050.ParamSize;
  UVar1 = TPM2B_MAX_BUFFER_Marshal(inData,&local_3080,&local_3088);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  TVar3 = TSS_DispatchCmd(tpm,0x164,&local_3078,1,&local_3070,1,&local_3050);
  if (TVar3 == 0) {
    TVar4 = TPM2B_MAX_BUFFER_Unmarshal
                      (outData,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
    TVar3 = 0x9a;
    if (TVar4 == 0) {
      if (ivOut == (TPM2B_IV *)0x0) {
        ivOut = &local_3062;
      }
      TVar4 = TPM2B_IV_Unmarshal(ivOut,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
      if (TVar4 == 0) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2_EncryptDecrypt(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          keyHandle,          // IN
    TPMI_YES_NO             decrypt,            // IN
    TPM_ALG_ID              cipherMode,         // IN
    TPM2B_IV               *ivIn,               // IN [opt]
    TPM2B_MAX_BUFFER       *inData,             // IN
    TPM2B_MAX_BUFFER       *outData,            // OUT
    TPM2B_IV               *ivOut               // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPMI_YES_NO, &decrypt);
    TSS_MARSHAL(TPM_ALG_ID, &cipherMode);
    TSS_MARSHAL_OPT2B(TPM2B_IV, ivIn);
    TSS_MARSHAL(TPM2B_MAX_BUFFER, inData);
    DISPATCH_CMD(EncryptDecrypt, &keyHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_MAX_BUFFER, outData);
    TSS_UNMARSHAL_OPT(TPM2B_IV, ivOut);
    END_CMD();
}